

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

FT_Error TT_Load_Context(TT_ExecContext exec,TT_Face face,TT_Size size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FT_Size_Metrics *pFVar3;
  FT_Memory pFVar4;
  FT_Fixed FVar5;
  FT_Fixed FVar6;
  FT_Pos FVar7;
  FT_Pos FVar8;
  undefined8 uVar9;
  FT_Vector *pFVar10;
  FT_Vector *pFVar11;
  FT_Vector *pFVar12;
  FT_UShort *pFVar13;
  FT_UShort FVar14;
  FT_UShort FVar15;
  undefined4 uVar16;
  FT_F2Dot14 FVar17;
  FT_Short FVar18;
  FT_Short FVar19;
  FT_UShort FVar20;
  undefined6 uVar21;
  int iVar22;
  FT_Byte *pFVar23;
  long lVar24;
  TT_Size_Metrics *pTVar25;
  TT_GraphicsState *pTVar26;
  TT_Size_Metrics *pTVar27;
  TT_GraphicsState *pTVar28;
  ulong new_count;
  FT_ULong tmp;
  FT_Error error;
  FT_ULong local_38;
  int local_2c;
  
  exec->face = face;
  exec->size = size;
  exec->numFDefs = size->num_function_defs;
  exec->maxFDefs = size->max_function_defs;
  exec->numIDefs = size->num_instruction_defs;
  exec->maxIDefs = size->max_instruction_defs;
  exec->FDefs = size->function_defs;
  exec->IDefs = size->instruction_defs;
  exec->pointSize = size->point_size;
  pTVar25 = &size->ttmetrics;
  pTVar27 = &exec->tt_metrics;
  for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
    pTVar27->x_ratio = pTVar25->x_ratio;
    pTVar25 = (TT_Size_Metrics *)&pTVar25->y_ratio;
    pTVar27 = (TT_Size_Metrics *)&pTVar27->y_ratio;
  }
  pFVar3 = size->metrics;
  (exec->metrics).max_advance = pFVar3->max_advance;
  FVar14 = pFVar3->x_ppem;
  FVar15 = pFVar3->y_ppem;
  uVar16 = *(undefined4 *)&pFVar3->field_0x4;
  FVar5 = pFVar3->x_scale;
  FVar6 = pFVar3->y_scale;
  FVar7 = pFVar3->ascender;
  FVar8 = pFVar3->height;
  (exec->metrics).descender = pFVar3->descender;
  (exec->metrics).height = FVar8;
  (exec->metrics).y_scale = FVar6;
  (exec->metrics).ascender = FVar7;
  (exec->metrics).x_ppem = FVar14;
  (exec->metrics).y_ppem = FVar15;
  *(undefined4 *)&(exec->metrics).field_0x4 = uVar16;
  (exec->metrics).x_scale = FVar5;
  exec->maxFunc = size->max_func;
  exec->maxIns = size->max_ins;
  lVar24 = 0;
  do {
    puVar1 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar24);
    uVar9 = puVar1[1];
    puVar2 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar24);
    *puVar2 = *puVar1;
    puVar2[1] = uVar9;
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x30);
  pTVar26 = &size->GS;
  pTVar28 = &exec->GS;
  for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
    FVar14 = pTVar26->rp1;
    FVar15 = pTVar26->rp2;
    FVar17 = (pTVar26->dualVector).x;
    pTVar28->rp0 = pTVar26->rp0;
    pTVar28->rp1 = FVar14;
    pTVar28->rp2 = FVar15;
    (pTVar28->dualVector).x = FVar17;
    pTVar26 = (TT_GraphicsState *)&(pTVar26->dualVector).y;
    pTVar28 = (TT_GraphicsState *)&(pTVar28->dualVector).y;
  }
  exec->cvtSize = size->cvt_size;
  exec->cvt = size->cvt;
  exec->storeSize = size->storage_size;
  exec->storage = size->storage;
  FVar14 = (size->twilight).max_points;
  FVar18 = (size->twilight).max_contours;
  FVar15 = (size->twilight).n_points;
  FVar19 = (size->twilight).n_contours;
  pFVar10 = (size->twilight).org;
  pFVar11 = (size->twilight).cur;
  pFVar12 = (size->twilight).orus;
  pFVar23 = (size->twilight).tags;
  pFVar13 = (size->twilight).contours;
  FVar20 = (size->twilight).first_point;
  uVar21 = *(undefined6 *)&(size->twilight).field_0x3a;
  (exec->twilight).memory = (size->twilight).memory;
  (exec->twilight).max_points = FVar14;
  (exec->twilight).max_contours = FVar18;
  (exec->twilight).n_points = FVar15;
  (exec->twilight).n_contours = FVar19;
  (exec->twilight).org = pFVar10;
  (exec->twilight).cur = pFVar11;
  (exec->twilight).orus = pFVar12;
  (exec->twilight).tags = pFVar23;
  (exec->twilight).contours = pFVar13;
  (exec->twilight).first_point = FVar20;
  *(undefined6 *)&(exec->twilight).field_0x3a = uVar21;
  memset(&exec->zp0,0,0xc0);
  local_38 = exec->stackSize;
  iVar22 = Update_Max(exec->memory,&local_38,8,&exec->stack,
                      (ulong)(face->max_profile).maxStackElements + 0x20);
  exec->stackSize = local_38;
  if (iVar22 == 0) {
    local_38 = (FT_ULong)exec->glyphSize;
    new_count = (ulong)(face->max_profile).maxSizeOfInstructions;
    iVar22 = 0;
    if (local_38 < new_count) {
      pFVar23 = (FT_Byte *)
                ft_mem_qrealloc(exec->memory,1,local_38,new_count,exec->glyphIns,&local_2c);
      exec->glyphIns = pFVar23;
      iVar22 = local_2c;
      if (local_2c == 0) {
        iVar22 = 0;
        local_38 = new_count;
      }
    }
    exec->glyphSize = (FT_UInt)local_38;
    if (iVar22 == 0) {
      (exec->pts).n_points = 0;
      (exec->pts).n_contours = 0;
      pFVar10 = (exec->pts).org;
      pFVar11 = (exec->pts).cur;
      pFVar12 = (exec->pts).orus;
      pFVar23 = (exec->pts).tags;
      FVar14 = (exec->pts).first_point;
      uVar21 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp1).contours = (exec->pts).contours;
      (exec->zp1).first_point = FVar14;
      *(undefined6 *)&(exec->zp1).field_0x3a = uVar21;
      (exec->zp1).orus = pFVar12;
      (exec->zp1).tags = pFVar23;
      (exec->zp1).org = pFVar10;
      (exec->zp1).cur = pFVar11;
      (exec->zp1).memory = (exec->pts).memory;
      FVar18 = (exec->pts).max_contours;
      (exec->zp1).max_points = (exec->pts).max_points;
      (exec->zp1).max_contours = FVar18;
      FVar18 = (exec->pts).n_contours;
      (exec->zp1).n_points = (exec->pts).n_points;
      (exec->zp1).n_contours = FVar18;
      pFVar4 = (exec->pts).memory;
      FVar15 = (exec->pts).max_points;
      FVar18 = (exec->pts).max_contours;
      FVar20 = (exec->pts).n_points;
      FVar19 = (exec->pts).n_contours;
      pFVar10 = (exec->pts).org;
      pFVar11 = (exec->pts).cur;
      pFVar12 = (exec->pts).orus;
      pFVar23 = (exec->pts).tags;
      FVar14 = (exec->pts).first_point;
      uVar21 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp2).contours = (exec->pts).contours;
      (exec->zp2).first_point = FVar14;
      *(undefined6 *)&(exec->zp2).field_0x3a = uVar21;
      (exec->zp2).orus = pFVar12;
      (exec->zp2).tags = pFVar23;
      (exec->zp2).org = pFVar10;
      (exec->zp2).cur = pFVar11;
      (exec->zp2).memory = pFVar4;
      (exec->zp2).max_points = FVar15;
      (exec->zp2).max_contours = FVar18;
      (exec->zp2).n_points = FVar20;
      (exec->zp2).n_contours = FVar19;
      pFVar4 = (exec->pts).memory;
      FVar15 = (exec->pts).max_points;
      FVar18 = (exec->pts).max_contours;
      FVar20 = (exec->pts).n_points;
      FVar19 = (exec->pts).n_contours;
      pFVar10 = (exec->pts).org;
      pFVar11 = (exec->pts).cur;
      pFVar12 = (exec->pts).orus;
      pFVar23 = (exec->pts).tags;
      FVar14 = (exec->pts).first_point;
      uVar21 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp0).contours = (exec->pts).contours;
      (exec->zp0).first_point = FVar14;
      *(undefined6 *)&(exec->zp0).field_0x3a = uVar21;
      (exec->zp0).orus = pFVar12;
      (exec->zp0).tags = pFVar23;
      (exec->zp0).org = pFVar10;
      (exec->zp0).cur = pFVar11;
      (exec->zp0).memory = pFVar4;
      (exec->zp0).max_points = FVar15;
      (exec->zp0).max_contours = FVar18;
      (exec->zp0).n_points = FVar20;
      (exec->zp0).n_contours = FVar19;
      exec->instruction_trap = '\0';
      iVar22 = 0;
    }
  }
  return iVar22;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Load_Context( TT_ExecContext  exec,
                   TT_Face         face,
                   TT_Size         size )
  {
    FT_Int          i;
    FT_ULong        tmp;
    TT_MaxProfile*  maxp;
    FT_Error        error;


    exec->face = face;
    maxp       = &face->max_profile;
    exec->size = size;

    if ( size )
    {
      exec->numFDefs   = size->num_function_defs;
      exec->maxFDefs   = size->max_function_defs;
      exec->numIDefs   = size->num_instruction_defs;
      exec->maxIDefs   = size->max_instruction_defs;
      exec->FDefs      = size->function_defs;
      exec->IDefs      = size->instruction_defs;
      exec->pointSize  = size->point_size;
      exec->tt_metrics = size->ttmetrics;
      exec->metrics    = *size->metrics;

      exec->maxFunc    = size->max_func;
      exec->maxIns     = size->max_ins;

      for ( i = 0; i < TT_MAX_CODE_RANGES; i++ )
        exec->codeRangeTable[i] = size->codeRangeTable[i];

      /* set graphics state */
      exec->GS = size->GS;

      exec->cvtSize = size->cvt_size;
      exec->cvt     = size->cvt;

      exec->storeSize = size->storage_size;
      exec->storage   = size->storage;

      exec->twilight  = size->twilight;

      /* In case of multi-threading it can happen that the old size object */
      /* no longer exists, thus we must clear all glyph zone references.   */
      FT_ZERO( &exec->zp0 );
      exec->zp1 = exec->zp0;
      exec->zp2 = exec->zp0;
    }

    /* XXX: We reserve a little more elements on the stack to deal safely */
    /*      with broken fonts like arialbs, courbs, timesbs, etc.         */
    tmp = (FT_ULong)exec->stackSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_F26Dot6 ),
                        (void*)&exec->stack,
                        maxp->maxStackElements + 32 );
    exec->stackSize = (FT_Long)tmp;
    if ( error )
      return error;

    tmp = (FT_ULong)exec->glyphSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_Byte ),
                        (void*)&exec->glyphIns,
                        maxp->maxSizeOfInstructions );
    exec->glyphSize = (FT_UInt)tmp;
    if ( error )
      return error;

    exec->pts.n_points   = 0;
    exec->pts.n_contours = 0;

    exec->zp1 = exec->pts;
    exec->zp2 = exec->pts;
    exec->zp0 = exec->pts;

    exec->instruction_trap = FALSE;

    return FT_Err_Ok;
  }